

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
EqualsFailure::EqualsFailure
          (EqualsFailure *this,UtestShell *test,char *fileName,size_t lineNumber,char *expected,
          char *actual,SimpleString *text)

{
  SimpleString *this_00;
  char *pcVar1;
  char *pcVar2;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_0016b820;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffb0,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffb0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  StringFromOrNull(&stack0xffffffffffffffd0);
  StringFromOrNull(&stack0xffffffffffffffc0);
  pcVar1 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffd0);
  pcVar2 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffc0);
  StringFromFormat(&stack0xffffffffffffffb0,"expected <%s>\n\tbut was  <%s>",pcVar1,pcVar2);
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffb0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

EqualsFailure::EqualsFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text) :
    TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
}